

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::HttpServer::Connection::reject(Connection *this)

{
  Maybe<unsigned_long> expectedBodySize;
  size_t in_RCX;
  char *in_RDX;
  int in_ESI;
  HttpHeaders *in_R8;
  StringPtr statusText;
  undefined8 in_stack_00000008;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_stack_fffffffffffffff0;
  
  expectedBodySize.ptr.field_1.value = in_stack_fffffffffffffff0.value;
  expectedBodySize.ptr._0_8_ = in_stack_00000008;
  statusText.content.size_ = in_RCX;
  statusText.content.ptr = in_RDX;
  reject(this,in_ESI - 8,statusText,in_R8,expectedBodySize);
  return;
}

Assistant:

kj::Own<kj::AsyncOutputStream> reject(
      uint statusCode,
      kj::StringPtr statusText,
      const HttpHeaders& headers,
      kj::Maybe<uint64_t> expectedBodySize) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    KJ_REQUIRE(method.is<HttpConnectMethod>(), "Only use reject() with CONNECT requests.");
    KJ_REQUIRE(statusCode < 200 || statusCode >= 300, "the statusCode must not be 2xx for reject.");
    tunnelRejected = Maybe<kj::Promise<LoopResult>>(BREAK_LOOP_CONN_OK);

    auto& fulfiller = KJ_ASSERT_NONNULL(tunnelWriteGuard, "the tunnel stream was not initialized");
    fulfiller->reject(KJ_EXCEPTION(DISCONNECTED, "the tunnel request was rejected"));
    closeAfterSend = true;
    return send(statusCode, statusText, headers, expectedBodySize);
  }